

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getDigits(char *zDate,char *zFormat,...)

{
  char cVar1;
  undefined8 *local_118;
  undefined8 local_f8 [22];
  int local_44;
  u16 max;
  int val;
  char min;
  char N;
  uint uStack_38;
  char nextC;
  int cnt;
  va_list ap;
  char *local_18;
  char *zFormat_local;
  char *zDate_local;
  
  val = 0;
  ap[0]._0_8_ = &stack0x00000008;
  uStack_38 = 0x10;
  local_18 = zFormat;
  zFormat_local = zDate;
  while( true ) {
    cVar1 = local_18[3];
    local_44 = 0;
    max._0_1_ = *local_18 + -0x30;
    while ((char)max != '\0') {
      if ((""[(byte)*zFormat_local] & 4) == 0) {
        return val;
      }
      local_44 = local_44 * 10 + (int)*zFormat_local + -0x30;
      zFormat_local = zFormat_local + 1;
      max._0_1_ = (char)max + -1;
    }
    if (local_44 < (char)(local_18[1] + -0x30)) {
      return val;
    }
    if ((int)(uint)getDigits::aMx[local_18[2] + -0x61] < local_44) {
      return val;
    }
    if ((cVar1 != '\0') && (cVar1 != *zFormat_local)) break;
    if (uStack_38 < 0x29) {
      local_118 = (undefined8 *)((long)local_f8 + (long)(int)uStack_38);
      uStack_38 = uStack_38 + 8;
    }
    else {
      local_118 = (undefined8 *)ap[0]._0_8_;
      ap[0]._0_8_ = ap[0]._0_8_ + 8;
    }
    *(int *)*local_118 = local_44;
    zFormat_local = zFormat_local + 1;
    val = val + 1;
    local_18 = local_18 + 4;
    if (cVar1 == '\0') {
      return val;
    }
  }
  return val;
}

Assistant:

static int getDigits(const char *zDate, const char *zFormat, ...){
  /* The aMx[] array translates the 3rd character of each format
  ** spec into a max size:    a   b   c   d   e     f */
  static const u16 aMx[] = { 12, 14, 24, 31, 59, 9999 };
  va_list ap;
  int cnt = 0;
  char nextC;
  va_start(ap, zFormat);
  do{
    char N = zFormat[0] - '0';
    char min = zFormat[1] - '0';
    int val = 0;
    u16 max;

    assert( zFormat[2]>='a' && zFormat[2]<='f' );
    max = aMx[zFormat[2] - 'a'];
    nextC = zFormat[3];
    val = 0;
    while( N-- ){
      if( !sqlite3Isdigit(*zDate) ){
        goto end_getDigits;
      }
      val = val*10 + *zDate - '0';
      zDate++;
    }
    if( val<(int)min || val>(int)max || (nextC!=0 && nextC!=*zDate) ){
      goto end_getDigits;
    }
    *va_arg(ap,int*) = val;
    zDate++;
    cnt++;
    zFormat += 4;
  }while( nextC );
end_getDigits:
  va_end(ap);
  return cnt;
}